

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void SingleTreeSearchHelper
               (ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,ON_RTreePairSearchResult *a_result)

{
  int iVar1;
  bool bVar2;
  ON_RTreeBranch *pOVar3;
  ON_2dex *pOVar4;
  ON_2dex *r;
  ON_RTreeBranch *branchBmax;
  ON_RTreeBranch *branchB;
  ON_RTreeBranch *branchAmax;
  ON_RTreeBranch *branchA;
  ON_RTreePairSearchResult *a_result_local;
  ON_RTreeNode *a_nodeB_local;
  ON_RTreeNode *a_nodeA_local;
  
  branchAmax = a_nodeA->m_branch;
  pOVar3 = branchAmax + a_nodeA->m_count;
  iVar1 = a_nodeB->m_count;
  if ((a_nodeA->m_level < 1) && (a_nodeB->m_level < 1)) {
    for (; branchAmax < pOVar3; branchAmax = branchAmax + 1) {
      for (branchBmax = a_nodeB->m_branch; branchBmax < a_nodeB->m_branch + iVar1;
          branchBmax = branchBmax + 1) {
        if ((branchAmax < branchBmax) &&
           (bVar2 = PairSearchOverlapHelper
                              (&branchAmax->m_rect,&branchBmax->m_rect,a_result->m_tolerance), bVar2
           )) {
          pOVar4 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
          pOVar4->i = (int)(branchAmax->field_1).m_id;
          pOVar4->j = (int)(branchBmax->field_1).m_id;
        }
      }
    }
  }
  else {
    for (; branchAmax < pOVar3; branchAmax = branchAmax + 1) {
      for (branchBmax = a_nodeB->m_branch; branchBmax < a_nodeB->m_branch + iVar1;
          branchBmax = branchBmax + 1) {
        bVar2 = PairSearchOverlapHelper
                          (&branchAmax->m_rect,&branchBmax->m_rect,a_result->m_tolerance);
        if (bVar2) {
          if (a_nodeA->m_level < 1) {
            SingleTreeSearchHelper(branchAmax,(branchBmax->field_1).m_child,a_result);
          }
          else if (a_nodeB->m_level < 1) {
            SingleTreeSearchHelper((branchAmax->field_1).m_child,branchBmax,a_result);
          }
          else {
            SingleTreeSearchHelper
                      ((branchAmax->field_1).m_child,(branchBmax->field_1).m_child,a_result);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;

  if (a_nodeA->m_level > 0 || a_nodeB->m_level > 0)
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          if (a_nodeA->m_level > 0)
          {
            if (a_nodeB->m_level > 0)
              SingleTreeSearchHelper(branchA->m_child, branchB->m_child, a_result);
            else
              SingleTreeSearchHelper(branchA->m_child, branchB, a_result);
          }
          else // a_nodeB->m_level > 0
          {
            SingleTreeSearchHelper(branchA, branchB->m_child, a_result);
          }
        }
      }
      branchA++;
    }
  }
  else
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        // branchA and branchB are leaf nodes in the same same tree.
        // Don't test pairs twice and don't test a node against itself.
        if (branchA < branchB)
        {
          if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
          {
            ON_2dex& r = a_result->m_result->AppendNew();
            r.i = (int)branchA->m_id;
            r.j = (int)branchB->m_id;
          }
        }
      }
      branchA++;
    }
  }

}